

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O2

void __thiscall CCIT<UFPC>::FirstScan(CCIT<UFPC> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  Mat1i *pMVar13;
  Mat1b *pMVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint *puVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  uint j;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  bool bVar38;
  long local_88;
  long local_80;
  long local_78;
  
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar24 = 0;
  memset(*(void **)&pMVar13->field_0x10,0,
         *(long *)&pMVar13->field_0x20 - *(long *)&pMVar13->field_0x18);
  puVar18 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar14 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar12 = *(int *)&pMVar13->field_0xc;
  lVar37 = (long)iVar12;
  iVar35 = *(int *)&pMVar13->field_0x8;
  lVar22 = (long)iVar35;
  lVar15 = *(long *)&pMVar14->field_0x10;
  lVar16 = **(long **)&pMVar14->field_0x48;
  uVar27 = lVar15 + lVar16;
  lVar17 = *(long *)&pMVar13->field_0x10;
  uVar23 = uVar27;
  do {
    uVar26 = UFPC::length_;
    if (iVar12 <= iVar24) {
      uVar27 = 2;
      local_78 = 1;
      local_80 = 3;
      local_88 = 0;
      do {
        if (lVar22 <= (long)uVar27) {
          return;
        }
        pMVar14 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar31 = *(long *)&pMVar14->field_0x10;
        lVar2 = **(long **)&pMVar14->field_0x48;
        lVar16 = lVar31 + lVar2 * uVar27;
        lVar29 = lVar16 - lVar2;
        lVar28 = lVar16 + lVar2;
        lVar3 = *(long *)&pMVar13->field_0x10;
        lVar4 = **(long **)&pMVar13->field_0x48;
        lVar17 = lVar3 + lVar4 * uVar27;
        lVar33 = lVar17 + lVar4 * -2;
        lVar30 = lVar29 + -1;
        lVar15 = lVar33 + -8;
        uVar34 = uVar27 | 1;
        uVar21 = 0;
        while (iVar35 = (int)uVar21, iVar35 < iVar12) {
          lVar25 = (long)iVar35;
          uVar1 = lVar25 + 1;
          iVar24 = (int)uVar1;
          if (*(char *)(lVar16 + lVar25) == '\0') {
            if ((iVar24 < iVar12) && (*(char *)(lVar16 + uVar1) != '\0')) {
              if (*(char *)(lVar29 + uVar1) == '\0') {
                if (*(char *)(lVar29 + lVar25) != '\0') {
                  uVar26 = *(uint *)(lVar33 + lVar25 * 4);
                  uVar23 = (ulong)uVar26;
                  *(uint *)(lVar17 + lVar25 * 4) = uVar26;
                  goto LAB_001bcc92;
                }
LAB_001bcd08:
                if (((int)(lVar25 + 2) < iVar12) && (*(char *)(lVar29 + lVar25 + 2) != '\0')) {
                  uVar23 = (ulong)*(uint *)(lVar33 + 8 + lVar25 * 4);
                }
                else {
LAB_001bcd22:
                  uVar23 = (ulong)UFPC::length_;
                  UFPC::P_[uVar23] = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                }
              }
              else {
                uVar23 = (ulong)*(uint *)(lVar33 + lVar25 * 4);
              }
              *(int *)(lVar17 + lVar25 * 4) = (int)uVar23;
              bVar38 = true;
            }
            else {
              if ((long)uVar34 < lVar22) {
                if (*(char *)(lVar28 + lVar25) == '\0') {
                  if ((iVar24 < iVar12) && (*(char *)(lVar28 + uVar1) != '\0')) goto LAB_001bcd22;
                }
                else {
                  uVar23 = (ulong)UFPC::length_;
                  UFPC::P_[uVar23] = UFPC::length_;
                  uVar26 = UFPC::length_ + 1;
                  *(uint *)(lVar17 + lVar25 * 4) = UFPC::length_;
                  UFPC::length_ = uVar26;
                  if ((iVar24 < iVar12) && (bVar38 = true, *(char *)(lVar28 + uVar1) != '\0'))
                  goto LAB_001bcd48;
                }
              }
LAB_001bcc6a:
              bVar38 = false;
            }
          }
          else if ((iVar24 < iVar12) && (*(char *)(lVar16 + uVar1) != '\0')) {
            if (*(char *)(lVar29 + lVar25) == '\0') {
              if (*(char *)(lVar29 + uVar1) == '\0') {
                if ((iVar35 < 2) || (*(char *)(lVar30 + uVar21) == '\0')) goto LAB_001bcd08;
                uVar26 = *(uint *)(lVar15 + uVar21 * 4);
                uVar23 = (ulong)uVar26;
                *(uint *)(lVar17 + lVar25 * 4) = uVar26;
                bVar38 = true;
                if (((int)(uVar21 + 2) < iVar12) && (*(char *)(lVar29 + uVar21 + 2) != '\0')) {
                  uVar26 = *(uint *)(lVar33 + 8 + uVar21 * 4);
                  goto LAB_001bccb3;
                }
              }
              else {
                uVar26 = *(uint *)(lVar33 + lVar25 * 4);
                uVar23 = (ulong)uVar26;
                *(uint *)(lVar17 + lVar25 * 4) = uVar26;
                bVar38 = true;
                if ((1 < iVar35) && (*(char *)(lVar30 + uVar21) != '\0')) {
                  uVar26 = *(uint *)(lVar15 + uVar21 * 4);
LAB_001bccb3:
                  bVar38 = true;
                  UFPC::Merge((uint)uVar23,uVar26);
                }
              }
            }
            else {
              uVar26 = *(uint *)(lVar33 + lVar25 * 4);
              uVar23 = (ulong)uVar26;
              *(uint *)(lVar17 + lVar25 * 4) = uVar26;
              bVar38 = true;
              if (*(char *)(lVar29 + uVar1) == '\0') {
LAB_001bcc92:
                bVar38 = true;
                if (((int)(lVar25 + 2) < iVar12) && (*(char *)(lVar29 + lVar25 + 2) != '\0')) {
                  uVar26 = *(uint *)(lVar33 + 8 + lVar25 * 4);
                  goto LAB_001bccb3;
                }
              }
            }
          }
          else {
            if (*(char *)(lVar29 + lVar25) == '\0') {
              if ((iVar35 < 2) || (*(char *)(lVar30 + uVar21) == '\0')) {
                if ((iVar24 < iVar12) && (*(char *)(lVar29 + uVar1) != '\0')) goto LAB_001bcac3;
                uVar23 = (ulong)UFPC::length_;
                UFPC::P_[uVar23] = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                goto LAB_001bcbde;
              }
              uVar26 = *(uint *)(lVar15 + uVar21 * 4);
              uVar23 = (ulong)uVar26;
              *(uint *)(lVar17 + lVar25 * 4) = uVar26;
              if (iVar12 <= iVar24) goto LAB_001bcc6a;
              if (*(char *)(lVar29 + (uVar1 & 0xffffffff)) != '\0') {
                UFPC::Merge(uVar26,*(uint *)(lVar33 + lVar25 * 4));
              }
            }
            else {
LAB_001bcac3:
              uVar23 = (ulong)*(uint *)(lVar33 + lVar25 * 4);
LAB_001bcbde:
              *(int *)(lVar17 + lVar25 * 4) = (int)uVar23;
            }
            bVar38 = false;
            if ((iVar24 < iVar12) && ((long)uVar34 < lVar22)) {
              bVar38 = *(char *)(lVar28 + uVar1) != '\0';
            }
          }
LAB_001bcd48:
          lVar5 = lVar2 * local_78 + lVar31 + 4 + lVar25;
          lVar6 = lVar3 + lVar4 * local_88 + 0x10 + lVar25 * 4;
          lVar20 = lVar2 * local_80 + lVar31 + 3 + lVar25;
          lVar7 = lVar31 + lVar2 * uVar27 + 3 + lVar25;
          lVar8 = lVar3 + lVar4 * uVar27 + 8 + lVar25 * 4;
          for (lVar36 = 0; (bVar38 && (lVar25 + lVar36 + 2 < lVar37)); lVar36 = lVar36 + 2) {
            lVar10 = lVar25 + 3 + lVar36;
            uVar26 = (uint)uVar23;
            if (*(char *)(lVar7 + -1 + lVar36) == '\0') {
              if ((lVar10 < lVar37) && (*(char *)(lVar7 + lVar36) != '\0')) {
                if (((long)uVar34 < lVar22) && (*(char *)(lVar20 + -1 + lVar36) != '\0')) {
                  *(uint *)(lVar8 + lVar36 * 4) = uVar26;
                  if (*(char *)(lVar5 + -1 + lVar36) == '\0') {
                    if (*(char *)(lVar5 + -2 + lVar36) != '\0') {
                      if ((lVar25 + lVar36 + 4 < lVar37) && (*(char *)(lVar5 + lVar36) != '\0')) {
                        uVar19 = UFPC::Merge(*(uint *)(lVar6 + -8 + lVar36 * 4),
                                             *(uint *)(lVar6 + lVar36 * 4));
                      }
                      else {
                        uVar19 = *(uint *)(lVar6 + -8 + lVar36 * 4);
                      }
                      goto LAB_001bd15b;
                    }
                  }
                  else {
                    uVar19 = *(uint *)(lVar6 + -8 + lVar36 * 4);
LAB_001bd15b:
                    UFPC::Merge(uVar26,uVar19);
                  }
                  if ((lVar25 + lVar36 + 4 < lVar37) && (*(char *)(lVar5 + lVar36) != '\0')) {
                    uVar19 = *(uint *)(lVar6 + lVar36 * 4);
                    goto LAB_001bd186;
                  }
                  goto LAB_001bd18b;
                }
                if (*(char *)(lVar5 + -1 + lVar36) == '\0') {
                  if (*(char *)(lVar5 + -2 + lVar36) != '\0') {
                    uVar26 = *(uint *)(lVar6 + -8 + lVar36 * 4);
                    uVar23 = (ulong)uVar26;
                    *(uint *)(lVar8 + lVar36 * 4) = uVar26;
                    bVar38 = true;
                    if ((lVar25 + lVar36 + 4 < lVar37) && (*(char *)(lVar5 + lVar36) != '\0')) {
                      UFPC::Merge(uVar26,*(uint *)(lVar6 + lVar36 * 4));
                    }
                    goto LAB_001bd136;
                  }
                  if ((lVar37 <= lVar25 + lVar36 + 4) || (*(char *)(lVar5 + lVar36) == '\0'))
                  goto LAB_001bd10f;
                  uVar23 = (ulong)*(uint *)(lVar6 + lVar36 * 4);
                }
                else {
                  uVar23 = (ulong)*(uint *)(lVar6 + -8 + lVar36 * 4);
                }
LAB_001bd12a:
                *(int *)(lVar8 + lVar36 * 4) = (int)uVar23;
LAB_001bd133:
                bVar38 = true;
                goto LAB_001bd136;
              }
              if ((long)uVar34 < lVar22) {
                if (*(char *)(lVar20 + -1 + lVar36) != '\0') {
                  *(uint *)(lVar8 + lVar36 * 4) = uVar26;
                  if (lVar37 <= lVar10) goto LAB_001bcfe0;
                  goto LAB_001bce60;
                }
                if ((lVar10 < lVar37) && (*(char *)(lVar20 + lVar36) != '\0')) {
LAB_001bd10f:
                  uVar23 = (ulong)UFPC::length_;
                  UFPC::P_[uVar23] = UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  goto LAB_001bd12a;
                }
              }
LAB_001bcfe0:
              bVar38 = false;
            }
            else {
              lVar9 = lVar25 + lVar36;
              *(uint *)(lVar8 + lVar36 * 4) = uVar26;
              if ((lVar37 <= lVar10) || (*(char *)(lVar7 + lVar36) == '\0')) {
                if (*(char *)(lVar5 + -2 + lVar36) == '\0') {
                  if ((-1 < lVar9) && (*(char *)(lVar5 + -3 + lVar36) != '\0')) {
                    if ((lVar10 < lVar37) && (*(char *)(lVar5 + -1 + lVar36) != '\0')) {
                      uVar19 = UFPC::Merge(*(uint *)(lVar6 + -0x10 + lVar36 * 4),
                                           *(uint *)(lVar6 + -8 + lVar36 * 4));
                    }
                    else {
                      uVar19 = *(uint *)(lVar6 + -0x10 + lVar36 * 4);
                    }
                    goto LAB_001bce35;
                  }
                  if (lVar37 <= lVar10) goto LAB_001bcfe0;
                  if (*(char *)(lVar5 + -1 + lVar36) != '\0') goto LAB_001bce2c;
                }
                else {
LAB_001bce2c:
                  uVar19 = *(uint *)(lVar6 + -8 + lVar36 * 4);
LAB_001bce35:
                  UFPC::Merge(uVar26,uVar19);
                }
                if ((lVar10 < lVar37) && ((long)uVar34 < lVar22)) {
LAB_001bce60:
                  bVar38 = true;
                  if (*(char *)(lVar20 + lVar36) != '\0') goto LAB_001bd136;
                }
                goto LAB_001bcfe0;
              }
              cVar11 = *(char *)(lVar5 + -1 + lVar36);
              if (*(char *)(lVar5 + -2 + lVar36) != '\0') {
                if (((cVar11 == '\0') && (lVar25 + lVar36 + 4 < lVar37)) &&
                   (*(char *)(lVar5 + lVar36) != '\0')) {
                  uVar19 = *(uint *)(lVar6 + -8 + lVar36 * 4);
LAB_001bce17:
                  j = *(uint *)(lVar6 + lVar36 * 4);
LAB_001bcfa2:
                  uVar19 = UFPC::Merge(uVar19,j);
                }
                else {
LAB_001bcfb0:
                  uVar19 = *(uint *)(lVar6 + -8 + lVar36 * 4);
                }
LAB_001bcfbe:
                UFPC::Merge(uVar26,uVar19);
                goto LAB_001bd133;
              }
              if (cVar11 != '\0') {
                if ((lVar9 < 0) || (*(char *)(lVar5 + -3 + lVar36) == '\0')) goto LAB_001bcfb0;
                uVar19 = *(uint *)(lVar6 + -0x10 + lVar36 * 4);
                j = *(uint *)(lVar6 + -8 + lVar36 * 4);
                goto LAB_001bcfa2;
              }
              if ((-1 < lVar9) && (*(char *)(lVar5 + -3 + lVar36) != '\0')) {
                if ((lVar25 + lVar36 + 4 < lVar37) && (*(char *)(lVar5 + lVar36) != '\0')) {
                  uVar19 = *(uint *)(lVar6 + -0x10 + lVar36 * 4);
                  goto LAB_001bce17;
                }
                uVar19 = *(uint *)(lVar6 + -0x10 + lVar36 * 4);
                goto LAB_001bcfbe;
              }
              bVar38 = true;
              if ((lVar37 <= lVar25 + lVar36 + 4) || (*(char *)(lVar5 + lVar36) == '\0'))
              goto LAB_001bd136;
              uVar19 = *(uint *)(lVar6 + lVar36 * 4);
LAB_001bd186:
              UFPC::Merge(uVar26,uVar19);
LAB_001bd18b:
              bVar38 = true;
            }
LAB_001bd136:
          }
          uVar21 = (ulong)(iVar35 + (int)lVar36 + 2);
        }
        uVar27 = uVar27 + 2;
        local_78 = local_78 + 2;
        local_88 = local_88 + 2;
        local_80 = local_80 + 2;
      } while( true );
    }
    lVar31 = (long)iVar24;
    if (*(char *)(lVar15 + lVar31) == '\0') {
      lVar2 = lVar31 + 1;
      iVar32 = (int)lVar2;
      if ((iVar32 < iVar12) && (*(char *)(lVar15 + lVar2) != '\0')) {
LAB_001bc7d7:
        uVar23 = (ulong)UFPC::length_;
        puVar18[uVar23] = UFPC::length_;
        uVar26 = UFPC::length_ + 1;
        *(uint *)(lVar17 + lVar31 * 4) = UFPC::length_;
        UFPC::length_ = uVar26;
        bVar38 = true;
        goto LAB_001bc847;
      }
      if (1 < iVar35) {
        if (*(char *)(uVar27 + lVar31) == '\0') {
          if ((iVar32 < iVar12) && (*(char *)(uVar27 + lVar2) != '\0')) goto LAB_001bc7d7;
        }
        else {
          uVar23 = (ulong)UFPC::length_;
          puVar18[uVar23] = UFPC::length_;
          uVar19 = UFPC::length_ + 1;
          *(uint *)(lVar17 + lVar31 * 4) = UFPC::length_;
          UFPC::length_ = uVar19;
          if (iVar32 < iVar12) goto LAB_001bc826;
        }
      }
LAB_001bc845:
      bVar38 = false;
    }
    else {
      uVar23 = (ulong)UFPC::length_;
      puVar18[uVar23] = UFPC::length_;
      uVar19 = UFPC::length_ + 1;
      *(uint *)(lVar17 + lVar31 * 4) = UFPC::length_;
      UFPC::length_ = uVar19;
      if (iVar12 <= (int)(lVar31 + 1)) goto LAB_001bc845;
      bVar38 = true;
      if (*(char *)(lVar15 + lVar31 + 1) == '\0') {
        if (1 < iVar35) {
LAB_001bc826:
          uVar23 = (ulong)uVar26;
          bVar38 = true;
          if (*(char *)(uVar27 + lVar31 + 1) != '\0') goto LAB_001bc847;
        }
        goto LAB_001bc845;
      }
    }
LAB_001bc847:
    lVar2 = lVar15 + 3 + lVar31;
    lVar3 = lVar16 + lVar15 + 3 + lVar31;
    lVar4 = lVar17 + 8 + lVar31 * 4;
    for (lVar33 = 0; (bVar38 && (lVar31 + lVar33 + 2 < lVar37)); lVar33 = lVar33 + 2) {
      lVar28 = lVar31 + 3 + lVar33;
      if (*(char *)(lVar2 + -1 + lVar33) == '\0') {
        if ((lVar28 < lVar37) && (*(char *)(lVar2 + lVar33) != '\0')) {
          if ((iVar35 < 2) || (*(char *)(lVar3 + -1 + lVar33) == '\0')) {
LAB_001bc8eb:
            uVar23 = (ulong)UFPC::length_;
            puVar18[uVar23] = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          *(int *)(lVar4 + lVar33 * 4) = (int)uVar23;
          bVar38 = true;
          goto LAB_001bc912;
        }
        if (1 < iVar35) {
          if (*(char *)(lVar3 + -1 + lVar33) == '\0') {
            if ((lVar28 < lVar37) && (*(char *)(lVar3 + lVar33) != '\0')) goto LAB_001bc8eb;
          }
          else {
            *(int *)(lVar4 + lVar33 * 4) = (int)uVar23;
            if (lVar28 < lVar37) goto LAB_001bc8d6;
          }
        }
LAB_001bc910:
        bVar38 = false;
      }
      else {
        *(int *)(lVar4 + lVar33 * 4) = (int)uVar23;
        if (lVar37 <= lVar28) goto LAB_001bc910;
        bVar38 = true;
        if (*(char *)(lVar2 + lVar33) == '\0') {
          if (1 < iVar35) {
LAB_001bc8d6:
            bVar38 = true;
            if (*(char *)(lVar3 + lVar33) != '\0') goto LAB_001bc912;
          }
          goto LAB_001bc910;
        }
      }
LAB_001bc912:
    }
    iVar24 = iVar24 + (int)lVar33 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }